

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O1

void die_follower(CHAR_DATA *ch)

{
  byte *pbVar1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *ch_00;
  bool bVar3;
  string_view fmt;
  
  if (ch != (CHAR_DATA *)0x0) {
    pCVar2 = ch->master;
    if (pCVar2 != (CHAR_DATA *)0x0) {
      if (pCVar2->pet == ch) {
        pCVar2->pet = (CHAR_DATA *)0x0;
      }
      stop_follower(ch);
    }
    ch->leader = (CHAR_DATA *)0x0;
    pCVar2 = char_list;
    while (ch_00 = pCVar2, ch_00 != (CHAR_DATA *)0x0) {
      pCVar2 = ch_00->next;
      bVar3 = is_npc(ch_00);
      if ((bVar3) &&
         ((bVar3 = is_affected(ch_00,(int)gsn_animate_dead), bVar3 ||
          (bVar3 = is_affected_by(ch_00,0x12), bVar3)))) {
        if (ch_00->master == ch) {
          pbVar1 = (byte *)((long)ch_00->affected_by + 2);
          *pbVar1 = *pbVar1 & 0xfb;
          switchD_002e4026::default(ch_00,(int)gsn_animate_dead);
          act("$n slowly fades away.",ch_00,(void *)0x0,(void *)0x0,0);
          extract_char(ch_00,true);
        }
      }
      else {
        if ((ch_00->master == ch) && (bVar3 = is_affected(ch_00,(int)gsn_trail), !bVar3)) {
          stop_follower(ch_00);
        }
        if ((ch_00->leader == ch) && (bVar3 = is_affected(ch_00,(int)gsn_trail), !bVar3)) {
          ch_00->leader = ch_00;
        }
      }
    }
    return;
  }
  fmt._M_str = "Error: Die follower, invalid master.";
  fmt._M_len = 0x24;
  CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
  return;
}

Assistant:

void die_follower(CHAR_DATA *ch)
{
	if (!ch)
	{
		RS.Logger.Debug("Error: Die follower, invalid master.");
		return;
	}

	if (ch->master != nullptr)
	{
		if (ch->master->pet == ch)
			ch->master->pet = nullptr;

		stop_follower(ch);
	}

	ch->leader = nullptr;

	CHAR_DATA *fch_next;
	for (auto fch = char_list; fch != nullptr; fch = fch_next)
	{
		fch_next = fch->next;
		/*if(!fch->in_room && is_npc(fch))
		{
			RS.Logger.Debug("Error: Mob {} in room is nullptr!",fch->pIndexData->vnum);
			break;
		}*/
		if (is_npc(fch) && (is_affected(fch, gsn_animate_dead) || is_affected_by(fch, AFF_CHARM)))
		{
			if (fch->master == ch)
			{
				REMOVE_BIT(fch->affected_by, AFF_CHARM);
				affect_strip(fch, gsn_animate_dead);
				act("$n slowly fades away.", fch, nullptr, nullptr, TO_ROOM);
				extract_char(fch, true);
			}
		}
		else
		{
			if (fch->master == ch && !is_affected(fch, gsn_trail))
				stop_follower(fch);

			if (fch->leader == ch && !is_affected(fch, gsn_trail))
				fch->leader = fch;
		}
	}
}